

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_GetOption(cmsysProcess *cp,int optionId)

{
  int iVar1;
  
  iVar1 = 0;
  if (cp != (cmsysProcess *)0x0) {
    iVar1 = 0;
    switch(optionId) {
    case 1:
      return cp->OptionDetach;
    case 2:
      return cp->MergeOutput;
    case 3:
      return cp->Verbatim;
    case 4:
      iVar1 = cp->CreateProcessGroup;
    }
  }
  return iVar1;
}

Assistant:

int kwsysProcess_GetOption(kwsysProcess* cp, int optionId)
{
  if(!cp)
    {
    return 0;
    }

  switch(optionId)
    {
    case kwsysProcess_Option_Detach: return cp->OptionDetach;
    case kwsysProcess_Option_MergeOutput: return cp->MergeOutput;
    case kwsysProcess_Option_Verbatim: return cp->Verbatim;
    case kwsysProcess_Option_CreateProcessGroup:
      return cp->CreateProcessGroup;
    default: return 0;
    }
}